

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::AssertionInstanceExpression::bindPort
          (Symbol *symbol,SourceRange range,ASTContext *instanceCtx)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  string_view arg;
  string_view arg_00;
  SourceRange range_00;
  AssertionInstanceDetails *pAVar1;
  Symbol **ppSVar2;
  bool bVar3;
  int iVar4;
  Compilation *this;
  Scope *this_00;
  Expression *pEVar5;
  CheckerInstanceBodySymbol *pCVar6;
  flat_hash_map<const_Symbol_*,_std::tuple<const_syntax::PropertyExprSyntax_*,_ASTContext>_> *pfVar7
  ;
  equal_to<const_slang::ast::Symbol_*> *this_01;
  raw_key_type *__y;
  Type *pTVar8;
  pointer ppVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  AssertionInstanceExpression *args_1;
  Symbol *in_RCX;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t sVar10;
  socklen_t extraout_EDX_01;
  socklen_t extraout_EDX_02;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  Expression *expr;
  TimingControl *timing_1;
  Type *resultType_1;
  AssertionExpr *result_2;
  Type *resultType;
  AssertionExpr *result_1;
  TimingControl *timing;
  Expression *result;
  AssertionInstanceDetails details;
  type *regExpr;
  type *seqExpr;
  type *argCtx;
  type *propExpr;
  Diagnostic *diag;
  anon_class_16_2_caa7b725 isAllowedIntType;
  SymbolKind typeKind;
  Type *type;
  AssertionPortSymbol *formal;
  ASTContext *ctx;
  const_iterator it;
  Scope *scope;
  Symbol *sym;
  AssertionInstanceDetails *inst;
  Compilation *comp;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  Expression *in_stack_fffffffffffffa38;
  undefined7 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa47;
  SourceLocation in_stack_fffffffffffffa48;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffa50;
  DiagCode DVar11;
  SourceRange *args_3;
  undefined7 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5f;
  byte bVar12;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffa60;
  SourceLocation in_stack_fffffffffffffa68;
  AssertionPortSymbol *in_stack_fffffffffffffa70;
  Type *in_stack_fffffffffffffa78;
  Diagnostic *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  SyntaxKind in_stack_fffffffffffffa8c;
  Compilation *in_stack_fffffffffffffa90;
  bool local_551;
  DeclaredType *in_stack_fffffffffffffab0;
  Type *local_540;
  Type *local_518;
  Type *in_stack_fffffffffffffaf0;
  Type *in_stack_fffffffffffffaf8;
  bool local_4c9;
  byte local_491;
  bitmask<slang::ast::ASTFlags> local_450;
  underlying_type local_448;
  AssertionInstanceExpression *local_440;
  undefined4 local_41c;
  undefined8 local_418;
  bitmask<slang::ast::ASTFlags> local_410;
  bitmask<slang::ast::ASTFlags> local_408;
  undefined1 local_3f9;
  Type *local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e1;
  Type *local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  bitmask<slang::ast::ASTFlags> local_3c8;
  bitmask<slang::ast::ASTFlags> local_3c0;
  undefined4 local_3b4;
  underlying_type local_3b0;
  AssertionInstanceExpression *local_3a8;
  SourceLocation local_390;
  AssertionInstanceDetails local_388;
  __tuple_element_t<1UL,_tuple<const_SequenceExprSyntax_*,_const_ExpressionSyntax_*>_> *local_2f8;
  __tuple_element_t<0UL,_tuple<const_SequenceExprSyntax_*,_const_ExpressionSyntax_*>_> *local_2f0;
  __tuple_element_t<1UL,_tuple<const_PropertyExprSyntax_*,_ASTContext>_> *local_2d8;
  __tuple_element_t<0UL,_tuple<const_PropertyExprSyntax_*,_ASTContext>_> *local_2d0;
  undefined1 local_2c8 [64];
  size_t local_288;
  char *local_280;
  undefined4 local_264;
  bitmask<slang::ast::ASTFlags> local_260;
  size_t local_258;
  char *local_250;
  undefined4 local_234;
  bitmask<slang::ast::ASTFlags> local_230;
  SourceLocation local_228;
  undefined4 local_21c;
  undefined4 local_204;
  Diagnostic *local_200;
  SymbolKind *local_1f8;
  Type *local_1f0;
  bitmask<slang::ast::ASTFlags> local_1e8;
  SymbolKind local_1dc;
  Type *local_1d8;
  AssertionPortSymbol *local_1d0;
  char *local_1c8;
  ASTContext *local_178;
  const_iterator local_170;
  Symbol *local_160;
  char_pointer local_158;
  table_element_pointer local_150;
  Scope *local_148;
  Symbol *local_140;
  AssertionInstanceDetails *local_138;
  AssertionInstanceExpression *local_108;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  Symbol **local_d0;
  flat_hash_map<const_Symbol_*,_std::tuple<const_syntax::PropertyExprSyntax_*,_ASTContext>_>
  *local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
  local_b0;
  Symbol **local_98;
  flat_hash_map<const_Symbol_*,_std::tuple<const_syntax::PropertyExprSyntax_*,_ASTContext>_>
  *local_90;
  iterator local_88;
  size_t local_78;
  Symbol **local_70;
  flat_hash_map<const_Symbol_*,_std::tuple<const_syntax::PropertyExprSyntax_*,_ASTContext>_>
  *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Symbol **local_10;
  flat_hash_map<const_Symbol_*,_std::tuple<const_syntax::PropertyExprSyntax_*,_ASTContext>_>
  *local_8;
  
  this = ASTContext::getCompilation((ASTContext *)0xf22684);
  local_138 = *(AssertionInstanceDetails **)&in_RCX->indexInScope;
  if (local_138 == (AssertionInstanceDetails *)0x0) {
    this_00 = not_null<const_slang::ast::Scope_*>::operator->
                        ((not_null<const_slang::ast::Scope_*> *)0xf226bc);
    local_140 = Scope::asSymbol(this_00);
    while (local_140->kind != CheckerInstanceBody) {
      local_148 = Symbol::getParentScope(local_140);
      if (local_148 == (Scope *)0x0) {
        pEVar5 = Expression::badExpr((Compilation *)
                                     CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                                     in_stack_fffffffffffffa38);
        return pEVar5;
      }
      local_140 = Scope::asSymbol(local_148);
    }
    pCVar6 = Symbol::as<slang::ast::CheckerInstanceBodySymbol>((Symbol *)0xf2273b);
    local_138 = pCVar6->assertionDetails;
  }
  if (local_138->argDetails != (AssertionInstanceDetails *)0x0) {
    local_138 = local_138->argDetails;
  }
  pAVar1 = local_138;
  pfVar7 = &local_138->argumentMap;
  local_d0 = &local_160;
  local_c8 = pfVar7;
  local_98 = local_d0;
  local_90 = pfVar7;
  local_70 = local_d0;
  local_68 = pfVar7;
  local_78 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
             ::hash_for<slang::ast::Symbol_const*>
                       ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                        (Symbol **)in_stack_fffffffffffffa38);
  ppSVar2 = local_70;
  local_18 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
             ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                            (size_t)in_stack_fffffffffffffa38);
  local_10 = ppSVar2;
  local_20 = local_78;
  local_8 = pfVar7;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
  while( true ) {
    local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
    local_40 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
               ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                         *)0xf228d3);
    local_40 = local_40 + local_38;
    local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match((group15<boost::unordered::detail::foa::plain_integral> *)
                       in_stack_fffffffffffffa48,
                       CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    if (local_44 != 0) {
      local_50 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                             *)0xf22921);
      local_58 = local_50 + local_38 * 0xf;
      do {
        local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        this_01 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                          *)0xf22974);
        ppSVar2 = local_10;
        __y = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
              ::
              key_from<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>
                        ((pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>
                          *)0xf229a7);
        bVar3 = std::equal_to<const_slang::ast::Symbol_*>::operator()(this_01,ppSVar2,__y);
        if (bVar3) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
          ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
          goto LAB_00f22aa4;
        }
        local_44 = local_44 - 1 & local_44;
      } while (local_44 != 0);
    }
    bVar3 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                              (size_t)in_stack_fffffffffffffa38);
    if (bVar3) break;
    bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_30,
                       (pAVar1->argumentMap).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                       .arrays.groups_size_mask);
    if (!bVar3) {
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
      ::table_locator(&local_b0);
LAB_00f22aa4:
      local_88 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 ::make_iterator((locator *)0xf22ab1);
      local_e0.pc_ = local_88.pc_;
      local_e0.p_ = local_88.p_;
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
      local_158 = local_c0.pc_;
      local_150 = local_c0.p_;
      local_170 = boost::unordered::
                  unordered_flat_map<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                  ::end((unordered_flat_map<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                         *)0xf22b47);
      bVar3 = boost::unordered::detail::foa::operator==
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffffa38);
      if (bVar3) {
        local_178 = local_138->prevContext;
        while (local_178 != (ASTContext *)0x0) {
          local_138 = local_178->assertionInstance;
          if ((local_138 == (AssertionInstanceDetails *)0x0) ||
             ((local_138->symbol != (Symbol *)0x0 && (local_138->symbol->kind == Checker)))) {
            local_1c8 = (in_RCX->name)._M_str;
            ASTContext::resetFlags
                      ((ASTContext *)in_stack_fffffffffffffa48,in_stack_fffffffffffffa50);
            range_00.endLoc = in_RSI;
            range_00.startLoc = in_RDI;
            pEVar5 = bindPort(in_RCX,range_00,(ASTContext *)this);
            return pEVar5;
          }
          local_178 = local_138->prevContext;
        }
        local_108 = (AssertionInstanceExpression *)
                    Expression::badExpr((Compilation *)
                                        CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40
                                                ),in_stack_fffffffffffffa38);
      }
      else {
        local_1d0 = Symbol::as<slang::ast::AssertionPortSymbol>((Symbol *)0xf22cb8);
        local_1d8 = DeclaredType::getType(in_stack_fffffffffffffab0);
        pTVar8 = Type::getCanonicalType
                           ((Type *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
        local_1dc = (pTVar8->super_Symbol).kind;
        if ((local_1dc != ErrorType) && (local_1dc != UntypedType)) {
          bitmask<slang::ast::ASTFlags>::bitmask(&local_1e8,AssertionDelayOrRepetition);
          bVar3 = bitmask<slang::ast::ASTFlags>::has
                            ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa50.m_bits,
                             (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa48);
          if (bVar3) {
            local_1f8 = &local_1dc;
            local_1f0 = local_1d8;
            bVar3 = bindPort::anon_class_16_2_caa7b725::operator()
                              ((anon_class_16_2_caa7b725 *)in_stack_fffffffffffffa48);
            if (!bVar3) {
              local_204 = 0x50007;
              sourceRange.endLoc = in_stack_fffffffffffffa68;
              sourceRange.startLoc = (SourceLocation)in_stack_fffffffffffffa60.m_bits;
              local_200 = ASTContext::addDiag((ASTContext *)
                                              CONCAT17(in_stack_fffffffffffffa5f,
                                                       in_stack_fffffffffffffa58),
                                              SUB84((ulong)in_stack_fffffffffffffa70 >> 0x20,0),
                                              sourceRange);
              DVar11 = SUB84(in_stack_fffffffffffffa50.m_bits >> 0x20,0);
              ast::operator<<((Diagnostic *)in_stack_fffffffffffffa90,
                              (Type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88))
              ;
              local_21c = 0x50001;
              local_228 = (local_1d0->super_Symbol).location;
              Diagnostic::addNote((Diagnostic *)
                                  CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                                  DVar11,in_stack_fffffffffffffa48);
              pEVar5 = Expression::badExpr((Compilation *)
                                           CONCAT17(in_stack_fffffffffffffa47,
                                                    in_stack_fffffffffffffa40),
                                           in_stack_fffffffffffffa38);
              return pEVar5;
            }
          }
          bitmask<slang::ast::ASTFlags>::bitmask(&local_230,LValue);
          bVar3 = bitmask<slang::ast::ASTFlags>::has
                            ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa50.m_bits,
                             (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa48);
          local_491 = 0;
          if (bVar3) {
            bVar3 = std::optional::operator_cast_to_bool
                              ((optional<slang::ast::ArgumentDirection> *)0xf22eb0);
            local_491 = bVar3 ^ 0xff;
          }
          if ((local_491 & 1) != 0) {
            local_234 = 0x80007;
            sourceRange_00.endLoc = in_stack_fffffffffffffa68;
            sourceRange_00.startLoc = (SourceLocation)in_stack_fffffffffffffa60.m_bits;
            ASTContext::addDiag((ASTContext *)
                                CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
                                SUB84((ulong)in_stack_fffffffffffffa70 >> 0x20,0),sourceRange_00);
            local_258 = (local_1d0->super_Symbol).name._M_len;
            local_250 = (local_1d0->super_Symbol).name._M_str;
            arg._M_len._4_4_ = in_stack_fffffffffffffa8c;
            arg._M_len._0_4_ = in_stack_fffffffffffffa88;
            arg._M_str = (char *)in_stack_fffffffffffffa90;
            Diagnostic::operator<<(in_stack_fffffffffffffa80,arg);
            pEVar5 = Expression::badExpr((Compilation *)
                                         CONCAT17(in_stack_fffffffffffffa47,
                                                  in_stack_fffffffffffffa40),
                                         in_stack_fffffffffffffa38);
            return pEVar5;
          }
        }
        bitmask<slang::ast::ASTFlags>::bitmask(&local_260,RecursivePropertyArg);
        bVar3 = bitmask<slang::ast::ASTFlags>::has
                          ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa50.m_bits,
                           (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa48);
        if (bVar3) {
          local_264 = 0x8d0007;
          sourceRange_01.endLoc = in_stack_fffffffffffffa68;
          sourceRange_01.startLoc = (SourceLocation)in_stack_fffffffffffffa60.m_bits;
          ASTContext::addDiag((ASTContext *)
                              CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
                              SUB84((ulong)in_stack_fffffffffffffa70 >> 0x20,0),sourceRange_01);
          local_288 = (local_1d0->super_Symbol).name._M_len;
          local_280 = (local_1d0->super_Symbol).name._M_str;
          arg_00._M_len._4_4_ = in_stack_fffffffffffffa8c;
          arg_00._M_len._0_4_ = in_stack_fffffffffffffa88;
          arg_00._M_str = (char *)in_stack_fffffffffffffa90;
          Diagnostic::operator<<(in_stack_fffffffffffffa80,arg_00);
          local_108 = (AssertionInstanceExpression *)
                      Expression::badExpr((Compilation *)
                                          CONCAT17(in_stack_fffffffffffffa47,
                                                   in_stack_fffffffffffffa40),
                                          in_stack_fffffffffffffa38);
        }
        else {
          ppVar9 = boost::unordered::detail::foa::
                   table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                   ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                 *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
          memcpy(local_2c8,&ppVar9->second,0x40);
          local_2d0 = std::get<0ul,slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>
                                ((tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                                  *)0xf23090);
          local_2d8 = std::get<1ul,slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>
                                ((tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                                  *)0xf230a5);
          if (*local_2d0 ==
              (__tuple_element_t<0UL,_tuple<const_PropertyExprSyntax_*,_ASTContext>_>)0x0) {
            local_108 = (AssertionInstanceExpression *)
                        Expression::badExpr((Compilation *)
                                            CONCAT17(in_stack_fffffffffffffa47,
                                                     in_stack_fffffffffffffa40),
                                            in_stack_fffffffffffffa38);
          }
          else {
            decomposePropExpr((PropertyExprSyntax *)
                              CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
            local_2f0 = std::
                        get<0ul,slang::syntax::SequenceExprSyntax_const*,slang::syntax::ExpressionSyntax_const*>
                                  ((tuple<const_slang::syntax::SequenceExprSyntax_*,_const_slang::syntax::ExpressionSyntax_*>
                                    *)0xf23106);
            local_2f8 = std::
                        get<1ul,slang::syntax::SequenceExprSyntax_const*,slang::syntax::ExpressionSyntax_const*>
                                  ((tuple<const_slang::syntax::SequenceExprSyntax_*,_const_slang::syntax::ExpressionSyntax_*>
                                    *)0xf2311b);
            bitmask<slang::ast::ASTFlags>::operator|=
                      (&local_2d8->flags,(bitmask<slang::ast::ASTFlags> *)&(in_RCX->name)._M_str);
            AssertionInstanceDetails::AssertionInstanceDetails
                      ((AssertionInstanceDetails *)in_stack_fffffffffffffa60.m_bits);
            local_390 = SourceRange::start((SourceRange *)&stack0xfffffffffffffee8);
            local_388.argDetails = local_2d8->assertionInstance;
            local_2d8->assertionInstance = &local_388;
            local_388.argExpansionLoc = local_390;
            if (local_1dc == EventType) {
              bitmask<slang::ast::ASTFlags>::bitmask(&local_408,EventExpression);
              DVar11 = SUB84((ulong)in_stack_fffffffffffffa70 >> 0x20,0);
              bVar3 = bitmask<slang::ast::ASTFlags>::has
                                ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa50.m_bits,
                                 (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa48);
              local_551 = false;
              sVar10 = extraout_EDX_01;
              if (bVar3) {
                bitmask<slang::ast::ASTFlags>::bitmask(&local_410,AllowClockingBlock);
                local_551 = bitmask<slang::ast::ASTFlags>::has
                                      ((bitmask<slang::ast::ASTFlags> *)
                                       in_stack_fffffffffffffa50.m_bits,
                                       (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa48);
                sVar10 = extraout_EDX_02;
              }
              if (local_551 == false) {
                local_41c = 0x500007;
                sourceRange_02.endLoc = in_stack_fffffffffffffa68;
                sourceRange_02.startLoc = (SourceLocation)in_stack_fffffffffffffa60.m_bits;
                ASTContext::addDiag((ASTContext *)
                                    CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
                                    DVar11,sourceRange_02);
                local_108 = (AssertionInstanceExpression *)
                            Expression::badExpr((Compilation *)
                                                CONCAT17(in_stack_fffffffffffffa47,
                                                         in_stack_fffffffffffffa40),
                                                in_stack_fffffffffffffa38);
              }
              else {
                iVar4 = TimingControl::bind((int)*local_2d0,(sockaddr *)local_2d8,sVar10);
                local_418 = CONCAT44(extraout_var_02,iVar4);
                Compilation::getVoidType(this);
                local_108 = (AssertionInstanceExpression *)
                            BumpAllocator::
                            emplace<slang::ast::ClockingEventExpression,slang::ast::Type_const&,slang::ast::TimingControl&,slang::SourceRange&>
                                      ((BumpAllocator *)in_stack_fffffffffffffa60.m_bits,
                                       (Type *)CONCAT17(in_stack_fffffffffffffa5f,
                                                        in_stack_fffffffffffffa58),
                                       (TimingControl *)in_stack_fffffffffffffa50.m_bits,
                                       (SourceRange *)in_stack_fffffffffffffa48);
              }
            }
            else if (local_1dc == UntypedType) {
              if (*local_2f8 ==
                  (__tuple_element_t<1UL,_tuple<const_SequenceExprSyntax_*,_const_ExpressionSyntax_*>_>
                   )0x0) {
                bitmask<slang::ast::ASTFlags>::bitmask(&local_3c0,EventExpression);
                bVar3 = bitmask<slang::ast::ASTFlags>::has
                                  ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa50.m_bits
                                   ,(bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa48);
                local_4c9 = false;
                sVar10 = extraout_EDX;
                if (bVar3) {
                  bitmask<slang::ast::ASTFlags>::bitmask(&local_3c8,AllowClockingBlock);
                  local_4c9 = bitmask<slang::ast::ASTFlags>::has
                                        ((bitmask<slang::ast::ASTFlags> *)
                                         in_stack_fffffffffffffa50.m_bits,
                                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa48)
                  ;
                  sVar10 = extraout_EDX_00;
                }
                if (local_4c9 == false) {
                  iVar4 = AssertionExpr::bind((int)*local_2d0,(sockaddr *)local_2d8,0);
                  local_3d8 = CONCAT44(extraout_var_00,iVar4);
                  if (*local_2f0 ==
                      (__tuple_element_t<0UL,_tuple<const_SequenceExprSyntax_*,_const_ExpressionSyntax_*>_>
                       )0x0) {
                    local_518 = Compilation::getType
                                          (in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c);
                  }
                  else {
                    local_518 = Compilation::getType
                                          (in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c);
                  }
                  local_3e0 = local_518;
                  local_3e1 = 0;
                  local_108 = BumpAllocator::
                              emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::AssertionPortSymbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                                        ((BumpAllocator *)in_stack_fffffffffffffa80,
                                         in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                                         (AssertionExpr *)in_stack_fffffffffffffa68,
                                         (bool *)in_stack_fffffffffffffa60.m_bits,
                                         (SourceRange *)
                                         CONCAT17(in_stack_fffffffffffffa5f,
                                                  in_stack_fffffffffffffa58));
                }
                else {
                  iVar4 = TimingControl::bind((int)*local_2d0,(sockaddr *)local_2d8,sVar10);
                  local_3d0 = CONCAT44(extraout_var,iVar4);
                  Compilation::getVoidType(this);
                  local_108 = (AssertionInstanceExpression *)
                              BumpAllocator::
                              emplace<slang::ast::ClockingEventExpression,slang::ast::Type_const&,slang::ast::TimingControl&,slang::SourceRange&>
                                        ((BumpAllocator *)in_stack_fffffffffffffa60.m_bits,
                                         (Type *)CONCAT17(in_stack_fffffffffffffa5f,
                                                          in_stack_fffffffffffffa58),
                                         (TimingControl *)in_stack_fffffffffffffa50.m_bits,
                                         (SourceRange *)in_stack_fffffffffffffa48);
                }
              }
              else {
                local_3b0 = (local_2d8->flags).m_bits;
                local_3a8 = (AssertionInstanceExpression *)
                            Expression::selfDetermined
                                      ((Compilation *)
                                       CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58)
                                       ,(ExpressionSyntax *)in_stack_fffffffffffffa50.m_bits,
                                       (ASTContext *)in_stack_fffffffffffffa48,
                                       in_stack_fffffffffffffa60);
                (local_3a8->super_Expression).sourceRange.startLoc = in_RSI;
                (local_3a8->super_Expression).sourceRange.endLoc = in_RDX;
                local_108 = local_3a8;
              }
            }
            else if (local_1dc - SequenceType < 2) {
              iVar4 = AssertionExpr::bind((int)*local_2d0,(sockaddr *)local_2d8,0);
              local_3f0 = CONCAT44(extraout_var_01,iVar4);
              if (local_1dc == SequenceType) {
                local_540 = Compilation::getType
                                      (in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c);
              }
              else {
                local_540 = Compilation::getType
                                      (in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c);
              }
              local_3f8 = local_540;
              local_3f9 = 0;
              local_108 = BumpAllocator::
                          emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::AssertionPortSymbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                                    ((BumpAllocator *)in_stack_fffffffffffffa80,
                                     in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                                     (AssertionExpr *)in_stack_fffffffffffffa68,
                                     (bool *)in_stack_fffffffffffffa60.m_bits,
                                     (SourceRange *)
                                     CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
            }
            else if (*local_2f8 ==
                     (__tuple_element_t<1UL,_tuple<const_SequenceExprSyntax_*,_const_ExpressionSyntax_*>_>
                      )0x0) {
              local_108 = (AssertionInstanceExpression *)
                          Expression::badExpr((Compilation *)
                                              CONCAT17(in_stack_fffffffffffffa47,
                                                       in_stack_fffffffffffffa40),
                                              in_stack_fffffffffffffa38);
            }
            else {
              local_448 = (local_2d8->flags).m_bits;
              args_1 = (AssertionInstanceExpression *)
                       Expression::selfDetermined
                                 ((Compilation *)
                                  CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
                                  (ExpressionSyntax *)in_stack_fffffffffffffa50.m_bits,
                                  (ASTContext *)in_stack_fffffffffffffa48,in_stack_fffffffffffffa60)
              ;
              (args_1->super_Expression).sourceRange.startLoc = in_RSI;
              (args_1->super_Expression).sourceRange.endLoc = in_RDX;
              args_3 = (SourceRange *)&(in_RCX->name)._M_str;
              local_440 = args_1;
              bitmask<slang::ast::ASTFlags>::bitmask(&local_450,LValue);
              bVar3 = bitmask<slang::ast::ASTFlags>::has
                                ((bitmask<slang::ast::ASTFlags> *)args_3,
                                 (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa48);
              bVar12 = 0;
              if (!bVar3) {
                not_null<const_slang::ast::Type_*>::operator->
                          ((not_null<const_slang::ast::Type_*> *)0xf238aa);
                in_stack_fffffffffffffa47 =
                     Type::isMatching(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
                bVar12 = in_stack_fffffffffffffa47 ^ 0xff;
              }
              if ((bVar12 & 1) == 0) {
                local_108 = local_440;
              }
              else {
                local_108 = (AssertionInstanceExpression *)
                            BumpAllocator::
                            emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind,slang::ast::Expression&,slang::SourceRange&>
                                      ((BumpAllocator *)in_stack_fffffffffffffa70,
                                       (Type *)in_stack_fffffffffffffa68,(ConversionKind *)args_1,
                                       (Expression *)CONCAT17(bVar12,in_stack_fffffffffffffa58),
                                       args_3);
              }
            }
            local_3b4 = 1;
            AssertionInstanceDetails::~AssertionInstanceDetails
                      ((AssertionInstanceDetails *)
                       CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
          }
        }
      }
      return &local_108->super_Expression;
    }
  }
  memset(&local_b0,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
  ::table_locator(&local_b0);
  goto LAB_00f22aa4;
}

Assistant:

Expression& AssertionInstanceExpression::bindPort(const Symbol& symbol, SourceRange range,
                                                  const ASTContext& instanceCtx) {
    Compilation& comp = instanceCtx.getCompilation();

    auto inst = instanceCtx.assertionInstance;
    if (!inst) {
        // This is only possible if we're in a checker instance,
        // so look upward until we find it.
        auto sym = &instanceCtx.scope->asSymbol();
        while (sym->kind != SymbolKind::CheckerInstanceBody) {
            auto scope = sym->getParentScope();
            if (!scope)
                return badExpr(comp, nullptr);

            sym = &scope->asSymbol();
        }

        inst = &sym->as<CheckerInstanceBodySymbol>().assertionDetails;
    }

    // When looking up an argument reference from within another expanded
    // argument, use that original location's context.
    if (inst->argDetails)
        inst = inst->argDetails;

    // The only way to reference an assertion port should be from within
    // an assertion or checker instance.
    auto it = inst->argumentMap.find(&symbol);
    if (it == inst->argumentMap.end()) {
        // Walk through our previous assertion contexts to see if one of
        // them is a checker instance, in which case this argument might
        // be a reference to a checker port.
        auto ctx = inst->prevContext;
        while (ctx) {
            inst = ctx->assertionInstance;
            if (!inst || (inst->symbol && inst->symbol->kind == SymbolKind::Checker))
                return bindPort(symbol, range, ctx->resetFlags(instanceCtx.flags));

            ctx = inst->prevContext;
        }

        SLANG_ASSERT(false);
        return badExpr(comp, nullptr);
    }

    auto& formal = symbol.as<AssertionPortSymbol>();
    auto& type = formal.declaredType.getType();
    auto typeKind = type.getCanonicalType().kind;

    if (typeKind != SymbolKind::ErrorType && typeKind != SymbolKind::UntypedType) {
        if (instanceCtx.flags.has(ASTFlags::AssertionDelayOrRepetition)) {
            auto isAllowedIntType = [&] {
                if (typeKind != SymbolKind::PredefinedIntegerType)
                    return false;

                auto ik = type.getCanonicalType().as<PredefinedIntegerType>().integerKind;
                return ik == PredefinedIntegerType::Int || ik == PredefinedIntegerType::ShortInt ||
                       ik == PredefinedIntegerType::LongInt;
            };

            if (!isAllowedIntType()) {
                auto& diag = instanceCtx.addDiag(diag::AssertionDelayFormalType, range);
                diag << type;
                diag.addNote(diag::NoteDeclarationHere, formal.location);
                return badExpr(comp, nullptr);
            }
        }

        if (instanceCtx.flags.has(ASTFlags::LValue) && !formal.direction) {
            instanceCtx.addDiag(diag::AssertionPortTypedLValue, range) << formal.name;
            return badExpr(comp, nullptr);
        }
    }

    if (instanceCtx.flags.has(ASTFlags::RecursivePropertyArg)) {
        instanceCtx.addDiag(diag::RecursivePropArgExpr, range) << formal.name;
        return badExpr(comp, nullptr);
    }

    auto [propExpr, argCtx] = it->second;
    if (!propExpr) {
        // The expression can be null when making default instances of
        // sequences and properties. Just return an invalid expression.
        return badExpr(comp, nullptr);
    }

    auto [seqExpr, regExpr] = decomposePropExpr(*propExpr);

    // Inherit any AST flags that are specific to this argument's instantiation.
    argCtx.flags |= instanceCtx.flags;

    AssertionInstanceDetails details;
    details.argExpansionLoc = range.start();
    details.prevContext = &instanceCtx;
    details.argDetails = argCtx.assertionInstance;
    argCtx.assertionInstance = &details;

    switch (typeKind) {
        case SymbolKind::UntypedType:
            // Untyped formals allow everything. Bind as a regular expression
            // if possible and fall back to an assertion expression if not.
            if (regExpr) {
                auto& result = selfDetermined(comp, *regExpr, argCtx, argCtx.flags);
                result.sourceRange = range;
                return result;
            }
            else if (instanceCtx.flags.has(ASTFlags::EventExpression) &&
                     instanceCtx.flags.has(ASTFlags::AllowClockingBlock)) {
                // In an event expression, a referenced argument gets interpreted
                // as an event expression itself and not as an assertion expression.
                auto& timing = TimingControl::bind(*propExpr, argCtx);
                return *comp.emplace<ClockingEventExpression>(comp.getVoidType(), timing, range);
            }
            else {
                auto& result = AssertionExpr::bind(*propExpr, argCtx);
                auto& resultType = seqExpr ? comp.getType(SyntaxKind::SequenceType)
                                           : comp.getType(SyntaxKind::PropertyType);
                return *comp.emplace<AssertionInstanceExpression>(resultType, formal, result,
                                                                  /* isRecursiveProperty */ false,
                                                                  range);
            }
        case SymbolKind::SequenceType:
        case SymbolKind::PropertyType: {
            auto& result = AssertionExpr::bind(*propExpr, argCtx);
            auto& resultType = typeKind == SymbolKind::SequenceType
                                   ? comp.getType(SyntaxKind::SequenceType)
                                   : comp.getType(SyntaxKind::PropertyType);

            return *comp.emplace<AssertionInstanceExpression>(resultType, formal, result,
                                                              /* isRecursiveProperty */ false,
                                                              range);
        }
        case SymbolKind::EventType:
            // If an event expression is allowed here, bind and return. Otherwise issue
            // an error, since an 'event' argument can only be used where event expressions
            // are allowed, regardless of what the actual argument expression looks like.
            if (instanceCtx.flags.has(ASTFlags::EventExpression) &&
                instanceCtx.flags.has(ASTFlags::AllowClockingBlock)) {
                auto& timing = TimingControl::bind(*propExpr, argCtx);
                return *comp.emplace<ClockingEventExpression>(comp.getVoidType(), timing, range);
            }

            instanceCtx.addDiag(diag::EventExprAssertionArg, range);
            return badExpr(comp, nullptr);
        default: {
            // Arguments should have already been checked for type correctness.
            if (!regExpr)
                return badExpr(comp, nullptr);

            auto& expr = selfDetermined(comp, *regExpr, argCtx, argCtx.flags);
            expr.sourceRange = range;

            if (!instanceCtx.flags.has(ASTFlags::LValue) && !expr.type->isMatching(type)) {
                return *comp.emplace<ConversionExpression>(type, ConversionKind::Explicit, expr,
                                                           range);
            }

            return expr;
        }
    }
}